

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O3

void __thiscall FM::OPNA::DataLoad(OPNA *this,OPNAData *data)

{
  OPNABase::DataLoad(&this->super_OPNABase,&data->opnabase);
  memcpy(this->rhythm,data->rhythm,0xc0);
  this->rhythmtl = data->rhythmtl;
  this->rhythmtvol = data->rhythmtvol;
  this->rhythmkey = data->rhythmkey;
  (this->super_OPNABase).super_OPNBase.csmch = (Channel4 *)&(this->super_OPNABase).field_0x840;
  return;
}

Assistant:

void OPNA::DataLoad(struct OPNAData* data) {
	OPNABase::DataLoad(&data->opnabase);
	memcpy(rhythm, data->rhythm, sizeof(Rhythm) * 6);
	rhythmtl = data->rhythmtl;
	rhythmtvol = data->rhythmtvol;
	rhythmkey = data->rhythmkey;
	csmch = &ch[2];
}